

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

void nifti_image_free(nifti_image *nim)

{
  if (nim != (nifti_image *)0x0) {
    if (nim->fname != (char *)0x0) {
      free(nim->fname);
    }
    if (nim->iname != (char *)0x0) {
      free(nim->iname);
    }
    if (nim->data != (void *)0x0) {
      free(nim->data);
    }
    nifti_free_extensions(nim);
    free(nim);
    return;
  }
  return;
}

Assistant:

void nifti_image_free( nifti_image *nim )
{
   if( nim == NULL ) return ;
   if( nim->fname != NULL ) free(nim->fname) ;
   if( nim->iname != NULL ) free(nim->iname) ;
   if( nim->data  != NULL ) free(nim->data ) ;
   (void)nifti_free_extensions( nim ) ;
   free(nim) ; return ;
}